

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  stbi_uc *psVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  stbi_uc *psVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  char *pcVar19;
  byte bVar20;
  uint uVar21;
  long lVar23;
  ulong uVar24;
  stbi_uc *psVar25;
  uint uVar26;
  byte *pbVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  stbi_uc *psVar32;
  byte *pbVar33;
  long lVar34;
  uint uVar35;
  long in_FS_OFFSET;
  bool bVar36;
  ulong local_68;
  ulong uVar22;
  
  bVar36 = depth == 0x10;
  uVar2 = x * out_n;
  uVar3 = uVar2 << bVar36;
  a_00 = a->s->img_n;
  lVar28 = (long)a_00;
  uVar4 = a_00 << bVar36;
  psVar6 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar36,0);
  a->out = psVar6;
  if (psVar6 == (stbi_uc *)0x0) {
    pcVar19 = "Out of memory";
  }
  else {
    iVar5 = stbi__mad3sizes_valid(a_00,x,depth,7);
    pcVar19 = "Corrupt PNG";
    if (iVar5 != 0) {
      uVar9 = a_00 * x;
      uVar21 = uVar9 * depth + 7 >> 3;
      uVar22 = (ulong)uVar21;
      if ((uVar21 + 1) * y <= raw_len) {
        if (y == 0) {
LAB_001b92d7:
          if (depth != 0x10) {
            return 1;
          }
LAB_001b92e7:
          if (uVar2 * y == 0) {
            return 1;
          }
          psVar6 = a->out;
          lVar28 = 0;
          do {
            puVar1 = (ushort *)(psVar6 + lVar28 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar28 = lVar28 + 1;
          } while (uVar2 * y != (int)lVar28);
          return 1;
        }
        bVar18 = *raw;
        if (bVar18 < 5) {
          lVar16 = (long)(out_n << bVar36);
          iVar5 = x - 1;
          uVar7 = (ulong)y;
          psVar6 = a->out;
          lVar11 = -lVar16;
          lVar31 = -(ulong)uVar3;
          uVar17 = 0;
          lVar34 = 0;
          local_68 = (ulong)x;
          do {
            if (depth < 8) {
              if (x < uVar21) break;
              psVar6 = psVar6 + (uVar2 - uVar21);
              uVar4 = 1;
              local_68 = uVar22;
            }
            if (lVar34 == 0) {
              bVar18 = ""[bVar18];
            }
            if (0 < (int)uVar4) {
              uVar24 = 0;
              do {
                switch(bVar18) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar8 = raw[uVar24 + 1];
                  goto LAB_001b8938;
                case 2:
                case 4:
                  bVar8 = psVar6[uVar24 + lVar31];
                  break;
                case 3:
                  bVar8 = psVar6[uVar24 + lVar31] >> 1;
                  break;
                default:
                  goto switchD_001b8920_default;
                }
                bVar8 = bVar8 + raw[uVar24 + 1];
LAB_001b8938:
                psVar6[uVar24] = bVar8;
switchD_001b8920_default:
                uVar24 = uVar24 + 1;
              } while (uVar4 != uVar24);
            }
            if (depth == 8) {
              lVar23 = (long)out_n;
              lVar12 = lVar28;
              if (a_00 != out_n) {
                psVar6[lVar28] = 0xff;
              }
LAB_001b898d:
              raw = raw + lVar12 + 1;
            }
            else {
              if (depth == 0x10) {
                lVar12 = (long)(int)uVar4;
                lVar23 = lVar16;
                if (a_00 != out_n) {
                  psVar6[lVar12] = 0xff;
                  psVar6[lVar12 + 1] = 0xff;
                }
                goto LAB_001b898d;
              }
              raw = raw + 2;
              lVar23 = 1;
            }
            psVar32 = psVar6 + lVar23;
            if (depth < 8 || a_00 == out_n) {
              uVar10 = ((int)local_68 + -1) * uVar4;
              switch(bVar18) {
              case 0:
                memcpy(psVar32,raw,(long)(int)uVar10);
                break;
              case 1:
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    psVar32[uVar17] = psVar6[uVar17 + (lVar23 - (int)uVar4)] + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar10 != uVar17);
                }
                break;
              case 2:
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    psVar32[uVar17] = psVar32[uVar17 + lVar31] + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar10 != uVar17);
                }
                break;
              case 3:
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    psVar32[uVar17] =
                         (char)((uint)psVar6[uVar17 + (lVar23 - (int)uVar4)] +
                                (uint)psVar32[uVar17 + lVar31] >> 1) + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar10 != uVar17);
                }
                break;
              case 4:
                if (0 < (int)uVar10) {
                  pbVar33 = psVar6 + (lVar23 - (int)uVar4);
                  uVar17 = 0;
                  do {
                    bVar18 = *pbVar33;
                    bVar8 = psVar32[lVar31];
                    bVar20 = pbVar33[lVar31];
                    iVar29 = ((uint)bVar8 + (uint)bVar18) - (uint)bVar20;
                    uVar26 = iVar29 - (uint)bVar18;
                    uVar35 = -uVar26;
                    if (0 < (int)uVar26) {
                      uVar35 = uVar26;
                    }
                    uVar14 = iVar29 - (uint)bVar8;
                    uVar26 = -uVar14;
                    if (0 < (int)uVar14) {
                      uVar26 = uVar14;
                    }
                    uVar30 = iVar29 - (uint)bVar20;
                    uVar14 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar14 = uVar30;
                    }
                    if (uVar26 <= uVar14) {
                      bVar20 = bVar8;
                    }
                    if (uVar14 < uVar35) {
                      bVar18 = bVar20;
                    }
                    if (uVar26 < uVar35) {
                      bVar18 = bVar20;
                    }
                    *psVar32 = bVar18 + raw[uVar17];
                    uVar17 = uVar17 + 1;
                    pbVar33 = pbVar33 + 1;
                    psVar32 = psVar32 + 1;
                  } while (uVar10 != uVar17);
                }
                break;
              case 5:
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    psVar32[uVar17] = (psVar6[uVar17 + (lVar23 - (int)uVar4)] >> 1) + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar10 != uVar17);
                }
                break;
              case 6:
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    psVar32[uVar17] = psVar6[uVar17 + (lVar23 - (int)uVar4)] + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar10 != uVar17);
                }
              }
              raw = raw + (int)uVar10;
LAB_001b8eab:
              if (lVar34 + 1U == uVar7) {
                if (depth < 8) {
                  if (y == 0) {
                    return 1;
                  }
                  uVar4 = x - 1;
                  lVar11 = uVar2 - uVar22;
                  lVar28 = (ulong)uVar4 + 1;
                  uVar21 = 0;
                  uVar17 = 0;
                  do {
                    bVar18 = 1;
                    if (color == 0) {
                      bVar18 = ""[depth];
                    }
                    psVar6 = a->out;
                    pbVar27 = psVar6 + uVar3 * (int)uVar17;
                    pbVar33 = pbVar27 + (uVar2 - uVar22);
                    uVar24 = (ulong)uVar21;
                    if (depth == 4) {
                      uVar10 = uVar9;
                      if (1 < (int)uVar9) {
                        psVar32 = psVar6 + lVar11;
                        uVar35 = uVar9;
                        do {
                          psVar6[uVar24] = (psVar32[uVar24] >> 4) * bVar18;
                          psVar6[uVar24 + 1] = (psVar32[uVar24] & 0xf) * bVar18;
                          uVar10 = uVar35 - 2;
                          psVar32 = psVar32 + 1;
                          psVar6 = psVar6 + 2;
                          bVar36 = 3 < uVar35;
                          uVar35 = uVar10;
                        } while (bVar36);
                        pbVar33 = psVar32 + uVar24;
                        pbVar27 = psVar6 + uVar24;
                      }
                      if (uVar10 == 1) {
                        *pbVar27 = (*pbVar33 >> 4) * bVar18;
                      }
                    }
                    else if (depth == 2) {
                      uVar10 = uVar9;
                      if (3 < (int)uVar9) {
                        psVar32 = psVar6 + lVar11;
                        uVar35 = uVar9;
                        do {
                          psVar6[uVar24] = (psVar32[uVar24] >> 6) * bVar18;
                          psVar6[uVar24 + 1] = (psVar32[uVar24] >> 4 & 3) * bVar18;
                          psVar6[uVar24 + 2] = (psVar32[uVar24] >> 2 & 3) * bVar18;
                          psVar6[uVar24 + 3] = (psVar32[uVar24] & 3) * bVar18;
                          uVar10 = uVar35 - 4;
                          psVar32 = psVar32 + 1;
                          psVar6 = psVar6 + 4;
                          bVar36 = 7 < uVar35;
                          uVar35 = uVar10;
                        } while (bVar36);
                        pbVar33 = psVar32 + uVar24;
                        pbVar27 = psVar6 + uVar24;
                      }
                      if (((0 < (int)uVar10) && (*pbVar27 = (*pbVar33 >> 6) * bVar18, uVar10 != 1))
                         && (pbVar27[1] = (*pbVar33 >> 4 & 3) * bVar18, uVar10 == 3)) {
                        pbVar27[2] = (*pbVar33 >> 2 & 3) * bVar18;
                      }
                    }
                    else if (depth == 1) {
                      uVar10 = uVar9;
                      if (7 < (int)uVar9) {
                        psVar32 = psVar6 + lVar11;
                        uVar35 = uVar9;
                        do {
                          psVar6[uVar24] = (char)psVar32[uVar24] >> 7 & bVar18;
                          psVar6[uVar24 + 1] = (char)(psVar32[uVar24] * '\x02') >> 7 & bVar18;
                          psVar6[uVar24 + 2] = (char)(psVar32[uVar24] << 2) >> 7 & bVar18;
                          psVar6[uVar24 + 3] = (char)(psVar32[uVar24] << 3) >> 7 & bVar18;
                          psVar6[uVar24 + 4] = (char)(psVar32[uVar24] << 4) >> 7 & bVar18;
                          psVar6[uVar24 + 5] = (char)(psVar32[uVar24] << 5) >> 7 & bVar18;
                          psVar6[uVar24 + 6] = (char)(psVar32[uVar24] << 6) >> 7 & bVar18;
                          bVar8 = bVar18;
                          if ((psVar32[uVar24] & 1) == 0) {
                            bVar8 = 0;
                          }
                          psVar6[uVar24 + 7] = bVar8;
                          uVar10 = uVar35 - 8;
                          psVar32 = psVar32 + 1;
                          psVar6 = psVar6 + 8;
                          bVar36 = 0xf < uVar35;
                          uVar35 = uVar10;
                        } while (bVar36);
                        pbVar33 = psVar32 + uVar24;
                        pbVar27 = psVar6 + uVar24;
                      }
                      if (((((0 < (int)uVar10) &&
                            (*pbVar27 = (char)*pbVar33 >> 7 & bVar18, uVar10 != 1)) &&
                           ((pbVar27[1] = (char)(*pbVar33 * '\x02') >> 7 & bVar18, 2 < uVar10 &&
                            ((pbVar27[2] = (char)(*pbVar33 << 2) >> 7 & bVar18, uVar10 != 3 &&
                             (pbVar27[3] = (char)(*pbVar33 << 3) >> 7 & bVar18, 4 < uVar10)))))) &&
                          (pbVar27[4] = (char)(*pbVar33 << 4) >> 7 & bVar18, uVar10 != 5)) &&
                         (pbVar27[5] = (char)(*pbVar33 << 5) >> 7 & bVar18, uVar10 == 7)) {
                        pbVar27[6] = (char)(*pbVar33 << 6) >> 7 & bVar18;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar6 = a->out;
                      if (a_00 == 1) {
                        lVar16 = lVar28;
                        if (-1 < (int)uVar4) {
                          do {
                            psVar6[lVar16 * 2 + (uVar24 - 1)] = 0xff;
                            psVar6[lVar16 * 2 + (uVar24 - 2)] = psVar6[lVar16 + (uVar24 - 1)];
                            lVar34 = lVar16 + -1;
                            bVar36 = 0 < lVar16;
                            lVar16 = lVar34;
                          } while (lVar34 != 0 && bVar36);
                        }
                      }
                      else if (-1 < (int)uVar4) {
                        psVar32 = psVar6 + (ulong)uVar4 * 3 + 2 + uVar24;
                        lVar16 = lVar28;
                        do {
                          psVar6[lVar16 * 4 + (uVar24 - 1)] = 0xff;
                          psVar6[lVar16 * 4 + (uVar24 - 2)] = *psVar32;
                          psVar6[lVar16 * 4 + (uVar24 - 3)] = psVar32[-1];
                          psVar6[lVar16 * 4 + (uVar24 - 4)] = psVar32[-2];
                          psVar32 = psVar32 + -3;
                          lVar34 = lVar16 + -1;
                          bVar36 = 0 < lVar16;
                          lVar16 = lVar34;
                        } while (lVar34 != 0 && bVar36);
                      }
                    }
                    uVar17 = uVar17 + 1;
                    uVar21 = uVar21 + uVar3;
                  } while (uVar17 != uVar7);
                  return 1;
                }
                goto LAB_001b92d7;
              }
            }
            else {
              switch(bVar18) {
              case 0:
                if (iVar5 != 0) {
                  iVar29 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar32[uVar24] = raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar32[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar32 = psVar32 + lVar16;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 1:
                if (iVar5 != 0) {
                  psVar6 = psVar6 + lVar23 + lVar11;
                  iVar29 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar32[uVar24] = psVar6[uVar24] + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar32[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar32 = psVar32 + lVar16;
                    psVar6 = psVar6 + lVar16;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 2:
                if (iVar5 != 0) {
                  iVar29 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar32[uVar24] = psVar32[uVar24 + lVar31] + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar32[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar32 = psVar32 + lVar16;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 3:
                if (iVar5 != 0) {
                  iVar29 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      psVar6 = psVar32;
                      do {
                        *psVar6 = (char)((uint)psVar6[lVar11] + (uint)psVar6[lVar31] >> 1) +
                                  raw[uVar24];
                        uVar24 = uVar24 + 1;
                        psVar6 = psVar6 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar32[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar32 = psVar32 + lVar16;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 4:
                if (iVar5 != 0) {
                  psVar13 = psVar6 + lVar23 + lVar31;
                  psVar25 = psVar6 + lVar23 + lVar11;
                  psVar6 = psVar6 + lVar23 + (lVar11 - (ulong)uVar3);
                  iVar29 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        bVar18 = psVar25[uVar24];
                        bVar8 = psVar13[uVar24];
                        bVar20 = psVar6[uVar24];
                        iVar15 = ((uint)bVar8 + (uint)bVar18) - (uint)bVar20;
                        uVar35 = iVar15 - (uint)bVar18;
                        uVar10 = -uVar35;
                        if (0 < (int)uVar35) {
                          uVar10 = uVar35;
                        }
                        uVar26 = iVar15 - (uint)bVar8;
                        uVar35 = -uVar26;
                        if (0 < (int)uVar26) {
                          uVar35 = uVar26;
                        }
                        uVar14 = iVar15 - (uint)bVar20;
                        uVar26 = -uVar14;
                        if (0 < (int)uVar14) {
                          uVar26 = uVar14;
                        }
                        if (uVar35 <= uVar26) {
                          bVar20 = bVar8;
                        }
                        if (uVar26 < uVar10) {
                          bVar18 = bVar20;
                        }
                        if (uVar35 < uVar10) {
                          bVar18 = bVar20;
                        }
                        psVar32[uVar24] = bVar18 + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar32[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar32 = psVar32 + lVar16;
                    psVar13 = psVar13 + lVar16;
                    psVar25 = psVar25 + lVar16;
                    psVar6 = psVar6 + lVar16;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 5:
                if (iVar5 != 0) {
                  psVar6 = psVar6 + lVar23 + lVar11;
                  iVar29 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar32[uVar24] = (psVar6[uVar24] >> 1) + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar32[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar32 = psVar32 + lVar16;
                    psVar6 = psVar6 + lVar16;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                break;
              case 6:
                if (iVar5 != 0) {
                  psVar6 = psVar6 + lVar23 + lVar11;
                  iVar29 = iVar5;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar32[uVar24] = psVar6[uVar24] + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar32[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar32 = psVar32 + lVar16;
                    psVar6 = psVar6 + lVar16;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
              }
              if (depth != 0x10) goto LAB_001b8eab;
              if (x != 0) {
                psVar6 = a->out + (long)(int)uVar4 + uVar17 + 1;
                uVar17 = (ulong)x;
                do {
                  *psVar6 = 0xff;
                  psVar6 = psVar6 + lVar16;
                  uVar10 = (int)uVar17 - 1;
                  uVar17 = (ulong)uVar10;
                } while (uVar10 != 0);
                goto LAB_001b8eab;
              }
              if (lVar34 + 1U == uVar7) goto LAB_001b92e7;
            }
            lVar34 = lVar34 + 1;
            uVar17 = (ulong)(uVar3 * (int)lVar34);
            psVar6 = a->out + uVar17;
            bVar18 = *raw;
          } while (bVar18 < 5);
          pcVar19 = "Corrupt PNG";
        }
        else {
          pcVar19 = "Corrupt PNG";
        }
      }
    }
  }
  *(char **)(in_FS_OFFSET + -0x68) = pcVar19;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }